

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O3

void iqxmlrpc::http::validator::unsigned_number(string *val)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  ctype *pcVar5;
  Malformed_packet *this;
  size_t sVar6;
  size_type sVar7;
  char errmsg [29];
  string local_a0;
  uint local_7c;
  char local_78 [40];
  ushort local_50;
  locale local_48;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_40;
  
  builtin_strncpy(local_78 + 0x10,"meric option",0xd);
  builtin_strncpy(local_78,"bad format of nu",0x10);
  std::locale::locale((locale *)&local_a0);
  local_50 = 0x800;
  std::locale::locale(&local_48,(locale *)&local_a0);
  sVar2 = val->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (val->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      bVar1 = pcVar3[sVar7];
      pcVar5 = std::use_facet<std::ctype<char>>(&local_48);
      if ((local_50 & *(ushort *)(*(long *)(pcVar5 + 0x30) + (ulong)bVar1 * 2)) == 0) {
        std::locale::~locale(&local_48);
        std::locale::~locale((locale *)&local_a0);
        this = (Malformed_packet *)__cxa_allocate_exception(0x18);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        sVar6 = strlen(local_78);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,local_78,local_78 + sVar6);
        Malformed_packet::Malformed_packet(this,&local_a0);
        __cxa_throw(this,&Malformed_packet::typeinfo,std::runtime_error::~runtime_error);
      }
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  std::locale::~locale(&local_48);
  std::locale::~locale((locale *)&local_a0);
  local_7c = 0;
  local_40.start = (val->_M_dataplus)._M_p;
  local_40.finish = local_40.start + val->_M_string_length;
  bVar4 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
          shr_unsigned<unsigned_int>(&local_40,&local_7c);
  if (bVar4) {
    return;
  }
  local_a0._M_dataplus._M_p = (pointer)&PTR__bad_cast_001891e8;
  local_a0._M_string_length = (size_type)&std::__cxx11::string::typeinfo;
  local_a0.field_2._M_allocated_capacity = (size_type)&unsigned_int::typeinfo;
  boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_a0);
}

Assistant:

void unsigned_number(const std::string& val)
{
  const char errmsg[] = "bad format of numeric option";

  try {
    if (!boost::all(val, boost::is_digit()))
      throw Malformed_packet(errmsg);

    boost::lexical_cast<unsigned>(val);
  } catch (const boost::bad_lexical_cast&) {
    throw Malformed_packet(errmsg);
  }
}